

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O3

bool __thiscall
tcmalloc::PageHeap::CheckList
          (PageHeap *this,Span *list,Length min_pages,Length max_pages,int freelist)

{
  ulong uVar1;
  Leaf *pLVar2;
  LogItem b;
  LogItem b_00;
  LogItem b_01;
  LogItem b_02;
  LogItem b_03;
  LogItem c;
  LogItem c_00;
  LogItem c_01;
  LogItem c_02;
  LogItem c_03;
  LogItem d;
  LogItem d_00;
  LogItem d_01;
  LogItem d_02;
  LogItem d_03;
  Span *pSVar3;
  Span *pSVar4;
  ulong uVar5;
  undefined4 uStack_104;
  anon_union_8_4_e5b1a622_for_u_ aStack_100;
  undefined4 uStack_f4;
  anon_union_8_4_e5b1a622_for_u_ aStack_f0;
  undefined4 uStack_e4;
  anon_union_8_4_e5b1a622_for_u_ aStack_e0;
  undefined4 uStack_d4;
  anon_union_8_4_e5b1a622_for_u_ aStack_d0;
  undefined4 uStack_c4;
  anon_union_8_4_e5b1a622_for_u_ aStack_c0;
  undefined4 uStack_b4;
  anon_union_8_4_e5b1a622_for_u_ aStack_b0;
  undefined4 uStack_a4;
  anon_union_8_4_e5b1a622_for_u_ aStack_a0;
  undefined4 uStack_94;
  anon_union_8_4_e5b1a622_for_u_ aStack_90;
  undefined4 uStack_84;
  anon_union_8_4_e5b1a622_for_u_ aStack_80;
  undefined4 uStack_74;
  anon_union_8_4_e5b1a622_for_u_ aStack_70;
  undefined4 uStack_64;
  anon_union_8_4_e5b1a622_for_u_ aStack_60;
  undefined4 uStack_54;
  anon_union_8_4_e5b1a622_for_u_ aStack_50;
  undefined4 uStack_44;
  anon_union_8_4_e5b1a622_for_u_ aStack_40;
  undefined4 uStack_34;
  anon_union_8_4_e5b1a622_for_u_ aStack_30;
  undefined4 uStack_24;
  anon_union_8_4_e5b1a622_for_u_ aStack_20;
  
  pSVar4 = list;
  while( true ) {
    pSVar4 = pSVar4->next;
    if (pSVar4 == list) {
      return true;
    }
    if (((byte)pSVar4->field_0x2b & 3) != freelist) {
      d_00._4_4_ = uStack_e4;
      d_00.tag_ = 4;
      c_00._4_4_ = uStack_f4;
      c_00.tag_ = 4;
      b_00._4_4_ = uStack_104;
      b_00.tag_ = 4;
      b_00.u_.str = aStack_100.str;
      c_00.u_.str = aStack_f0.str;
      d_00.u_.str = aStack_e0.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc"
          ,0x32a,(LogItem)(ZEXT816(0x12f8fb) << 0x40),b_00,c_00,d_00);
      do {
      } while( true );
    }
    uVar5 = pSVar4->length;
    if (uVar5 < min_pages) {
      d_01._4_4_ = uStack_b4;
      d_01.tag_ = 4;
      c_01._4_4_ = uStack_c4;
      c_01.tag_ = 4;
      b_01._4_4_ = uStack_d4;
      b_01.tag_ = 4;
      b_01.u_.str = aStack_d0.str;
      c_01.u_.str = aStack_c0.str;
      d_01.u_.str = aStack_b0.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc"
          ,0x32b,(LogItem)(ZEXT816(0x12f913) << 0x40),b_01,c_01,d_01);
      do {
      } while( true );
    }
    if (max_pages < uVar5) break;
    uVar1 = pSVar4->start;
    if ((uVar1 < 0x800000000) &&
       (pLVar2 = (this->pagemap_).root_[uVar1 >> 0x12], pLVar2 != (Leaf *)0x0)) {
      pSVar3 = (Span *)pLVar2->values[(uint)uVar1 & 0x3ffff];
    }
    else {
      pSVar3 = (Span *)0x0;
    }
    if (pSVar3 != pSVar4) {
      d_03._4_4_ = uStack_54;
      d_03.tag_ = 4;
      c_03._4_4_ = uStack_64;
      c_03.tag_ = 4;
      b_03._4_4_ = uStack_74;
      b_03.tag_ = 4;
      b_03.u_.str = aStack_70.str;
      c_03.u_.str = aStack_60.str;
      d_03.u_.str = aStack_50.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc"
          ,0x32d,(LogItem)(ZEXT816(0x12f941) << 0x40),b_03,c_03,d_03);
      do {
      } while( true );
    }
    uVar5 = (uVar5 + uVar1) - 1;
    if ((uVar5 < 0x800000000) &&
       (pLVar2 = (this->pagemap_).root_[uVar5 >> 0x12], pLVar2 != (Leaf *)0x0)) {
      pSVar3 = (Span *)pLVar2->values[(uint)uVar5 & 0x3ffff];
    }
    else {
      pSVar3 = (Span *)0x0;
    }
    if (pSVar3 != pSVar4) {
      d._4_4_ = uStack_24;
      d.tag_ = 4;
      c._4_4_ = uStack_34;
      c.tag_ = 4;
      b._4_4_ = uStack_44;
      b.tag_ = 4;
      b.u_.str = aStack_40.str;
      c.u_.str = aStack_30.str;
      d.u_.str = aStack_20.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc"
          ,0x32e,(LogItem)(ZEXT816(0x12f95e) << 0x40),b,c,d);
      do {
      } while( true );
    }
  }
  d_02._4_4_ = uStack_84;
  d_02.tag_ = 4;
  c_02._4_4_ = uStack_94;
  c_02.tag_ = 4;
  b_02._4_4_ = uStack_a4;
  b_02.tag_ = 4;
  b_02.u_.str = aStack_a0.str;
  c_02.u_.str = aStack_90.str;
  d_02.u_.str = aStack_80.str;
  Log(kCrash,
      "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/page_heap.cc",
      0x32c,(LogItem)(ZEXT816(0x12f92a) << 0x40),b_02,c_02,d_02);
  do {
  } while( true );
}

Assistant:

bool PageHeap::CheckList(Span* list, Length min_pages, Length max_pages,
                         int freelist) {
  for (Span* s = list->next; s != list; s = s->next) {
    CHECK_CONDITION(s->location == freelist);  // NORMAL or RETURNED
    CHECK_CONDITION(s->length >= min_pages);
    CHECK_CONDITION(s->length <= max_pages);
    CHECK_CONDITION(GetDescriptor(s->start) == s);
    CHECK_CONDITION(GetDescriptor(s->start+s->length-1) == s);
  }
  return true;
}